

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eccommit_impl.h
# Opt level: O3

int secp256k1_ec_commit_tweak
              (uchar *tweak32,secp256k1_ge *pubp,secp256k1_sha256 *sha,uchar *data,size_t data_size)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined4 extraout_EAX;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  uchar *puVar10;
  ulong uVar11;
  uint64_t uVar12;
  long lVar13;
  int iVar14;
  secp256k1_ge *a;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  ulong uVar21;
  ulong uVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uchar rbuf [33];
  int iStack_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  secp256k1_modinv64_signed62 sStack_90;
  secp256k1_sha256 *psStack_68;
  code *pcStack_60;
  byte local_58;
  uchar local_57 [39];
  secp256k1_modinv64_signed62 *r;
  
  pcStack_60 = (code *)0x147cf5;
  puVar10 = data;
  secp256k1_ge_verify(pubp);
  uVar8 = SUB84(puVar10,0);
  iVar7 = 0;
  if (pubp->infinity == 0) {
    pcStack_60 = (code *)0x147d06;
    secp256k1_fe_normalize(&pubp->x);
    psVar15 = &pubp->y;
    pcStack_60 = (code *)0x147d12;
    secp256k1_fe_normalize(psVar15);
    pcStack_60 = (code *)0x147d1f;
    a = pubp;
    secp256k1_fe_get_b32(local_57,&pubp->x);
    pcStack_60 = (code *)0x147d27;
    r_00 = psVar15;
    secp256k1_fe_verify(psVar15);
    if ((pubp->y).normalized == 0) {
      pcStack_60 = secp256k1_scalar_inverse;
      secp256k1_ec_commit_tweak_cold_1();
      uVar21 = (a->x).n[2] | (a->x).n[0];
      uVar24 = (a->x).n[3] | (a->x).n[1];
      r = &sStack_90;
      psStack_68 = sha;
      pcStack_60 = (code *)tweak32;
      secp256k1_scalar_to_signed62(r,(secp256k1_scalar *)a);
      secp256k1_modinv64(r,&secp256k1_const_modinfo_scalar);
      psVar15 = r_00;
      secp256k1_scalar_from_signed62((secp256k1_scalar *)r_00,r);
      iVar14 = (int)r;
      auVar22._0_4_ = -(uint)((int)r_00->n[2] == 0 && (int)r_00->n[0] == 0);
      auVar22._4_4_ =
           -(uint)(*(int *)((long)r_00->n + 0x14) == 0 && *(int *)((long)r_00->n + 4) == 0);
      auVar22._8_4_ = -(uint)((int)r_00->n[3] == 0 && (int)r_00->n[1] == 0);
      auVar22._12_4_ =
           -(uint)(*(int *)((long)r_00->n + 0x1c) == 0 && *(int *)((long)r_00->n + 0xc) == 0);
      iVar7 = movmskps(extraout_EAX,auVar22);
      iStack_a0 = (int)uVar21;
      iStack_9c = (int)(uVar21 >> 0x20);
      iStack_98 = (int)uVar24;
      iStack_94 = (int)(uVar24 >> 0x20);
      auVar23._0_4_ = -(uint)(iStack_a0 == 0);
      auVar23._4_4_ = -(uint)(iStack_9c == 0);
      auVar23._8_4_ = -(uint)(iStack_98 == 0);
      auVar23._12_4_ = -(uint)(iStack_94 == 0);
      iVar9 = movmskps(uVar8,auVar23);
      if ((iVar9 != 0xf) == (iVar7 == 0xf)) {
        secp256k1_scalar_inverse_cold_1();
        lVar13 = (long)iVar14;
        uVar21 = psVar15->n[3];
        uVar12 = 0;
        uVar11 = -lVar13;
        uVar17 = psVar15->n[0] ^ uVar11;
        uVar16 = psVar15->n[1] ^ uVar11;
        uVar18 = psVar15->n[2] ^ uVar11;
        uVar24 = (ulong)CARRY8(uVar11 & 0xbfd25e8cd0364142,uVar17);
        uVar1 = (uVar11 & 0xbaaedce6af48a03b) + uVar16;
        uVar16 = (ulong)(CARRY8(uVar11 & 0xbaaedce6af48a03b,uVar16) || CARRY8(uVar1,uVar24));
        uVar2 = (uVar11 & 0xfffffffffffffffe) + uVar18;
        bVar5 = psVar15->n[1] == 0;
        bVar6 = psVar15->n[0] == 0;
        bVar4 = psVar15->n[2] == 0;
        bVar3 = uVar21 == 0;
        uVar20 = (uVar11 & 0xbfd25e8cd0364142) + uVar17;
        if (((bVar5 && bVar6) && bVar4) && bVar3) {
          uVar20 = uVar12;
        }
        psVar15->n[0] = uVar20;
        uVar20 = uVar1 + uVar24;
        if (((bVar5 && bVar6) && bVar4) && bVar3) {
          uVar20 = uVar12;
        }
        psVar15->n[1] = uVar20;
        uVar19 = ((uVar21 ^ uVar11) - lVar13) +
                 (ulong)(CARRY8(uVar11 & 0xfffffffffffffffe,uVar18) || CARRY8(uVar2,uVar16));
        uVar20 = uVar2 + uVar16;
        if (((bVar5 && bVar6) && bVar4) && bVar3) {
          uVar19 = uVar12;
          uVar20 = uVar12;
        }
        psVar15->n[2] = uVar20;
        psVar15->n[3] = uVar19;
        return -(uint)(lVar13 != 0) | 1;
      }
      return CONCAT31((int3)((uint)iVar7 >> 8),iVar7 == 0xf);
    }
    local_58 = (byte)psVar15->n[0] & 1 | 2;
    pcStack_60 = (code *)0x147d47;
    secp256k1_sha256_write(sha,&local_58,0x21);
    pcStack_60 = (code *)0x147d55;
    secp256k1_sha256_write(sha,data,data_size);
    pcStack_60 = (code *)0x147d60;
    secp256k1_sha256_finalize(sha,tweak32);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int secp256k1_ec_commit_tweak(unsigned char *tweak32, secp256k1_ge* pubp, secp256k1_sha256* sha, const unsigned char *data, size_t data_size)
{
    unsigned char rbuf[33];

    if (!secp256k1_ec_commit_pubkey_serialize_const(pubp, rbuf)) {
        return 0;
    }
    secp256k1_sha256_write(sha, rbuf, sizeof(rbuf));
    secp256k1_sha256_write(sha, data, data_size);
    secp256k1_sha256_finalize(sha, tweak32);
    return 1;
}